

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void power_on(Terminal *term,_Bool clear)

{
  undefined4 uVar1;
  _Bool _Var2;
  int iVar3;
  wchar_t wVar4;
  int local_1c;
  wchar_t local_18;
  wchar_t i_1;
  wchar_t i;
  _Bool clear_local;
  Terminal *term_local;
  
  term->alt_y = L'\0';
  term->alt_x = L'\0';
  (term->savecurs).y = L'\0';
  (term->savecurs).x = L'\0';
  (term->alt_savecurs).y = L'\0';
  (term->alt_savecurs).x = L'\0';
  term->marg_t = L'\0';
  term->alt_t = L'\0';
  if (term->rows == L'\xffffffff') {
    term->marg_b = L'\0';
    term->alt_b = L'\0';
  }
  else {
    wVar4 = term->rows + L'\xffffffff';
    term->marg_b = wVar4;
    term->alt_b = wVar4;
  }
  if (term->cols != L'\xffffffff') {
    for (local_18 = L'\0'; local_18 < term->cols; local_18 = local_18 + L'\x01') {
      term->tabs[local_18] = local_18 % 8 == 0;
    }
  }
  _Var2 = conf_get_bool(term->conf,0x6b);
  term->dec_om = _Var2;
  term->alt_om = _Var2;
  term->alt_ins = false;
  term->insert = false;
  term->alt_wnext = false;
  term->wrapnext = false;
  term->save_wnext = false;
  term->alt_save_wnext = false;
  _Var2 = conf_get_bool(term->conf,0x6c);
  term->wrap = _Var2;
  term->alt_wrap = _Var2;
  term->alt_save_cset = L'\0';
  term->save_cset = L'\0';
  term->cset = L'\0';
  term->alt_cset = L'\0';
  term->alt_utf = false;
  term->utf = false;
  term->save_utf = false;
  term->alt_save_utf = false;
  (term->utf8).state = L'\0';
  term->alt_save_sco_acs = L'\0';
  term->save_sco_acs = L'\0';
  term->sco_acs = L'\0';
  term->alt_sco_acs = L'\0';
  term->alt_save_csattr = L'\xd800';
  term->save_csattr = L'\xd800';
  term->cset_attr[1] = L'\xd800';
  term->cset_attr[0] = L'\xd800';
  term->rvideo = false;
  term->in_vbell = false;
  term->cursor_on = true;
  term->big_cursor = false;
  term->curr_attr = L'𠔀';
  term->alt_save_attr = L'𠔀';
  term->save_attr = L'𠔀';
  term->default_attr = L'𠔀';
  (term->curr_truecolour).bg.enabled = false;
  (term->curr_truecolour).bg.r = '\0';
  (term->curr_truecolour).bg.g = '\0';
  (term->curr_truecolour).bg.b = '\0';
  (term->curr_truecolour).fg = (term->curr_truecolour).bg;
  term->alt_save_truecolour = term->curr_truecolour;
  term->save_truecolour = term->alt_save_truecolour;
  _Var2 = conf_get_bool(term->conf,0x56);
  term->app_cursor_keys = _Var2;
  _Var2 = conf_get_bool(term->conf,0x57);
  term->app_keypad_keys = _Var2;
  _Var2 = conf_get_bool(term->conf,0x7a);
  term->use_bce = _Var2;
  _Var2 = conf_get_bool(term->conf,0x7b);
  term->blink_is_real = _Var2;
  (term->erase_char).chr = (term->basic_erase_char).chr;
  (term->erase_char).attr = (term->basic_erase_char).attr;
  (term->erase_char).truecolour = (term->basic_erase_char).truecolour;
  uVar1 = *(undefined4 *)&(term->basic_erase_char).field_0x1c;
  (term->erase_char).cc_next = (term->basic_erase_char).cc_next;
  *(undefined4 *)&(term->erase_char).field_0x1c = uVar1;
  term->alt_which = L'\0';
  term_print_finish(term);
  term->xterm_mouse = L'\0';
  term->xterm_extended_mouse = false;
  term->urxvt_extended_mouse = false;
  win_set_raw_mouse_mode(term->win,false);
  term->win_pointer_shape_pending = true;
  term->win_pointer_shape_raw = false;
  term->bracketed_paste = false;
  term->srm_echo = false;
  for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
    iVar3 = conf_get_int_int(term->conf,0x9d,local_1c);
    term->wordness[local_1c] = (short)iVar3;
  }
  if (term->screen == (tree234 *)0x0) {
    (term->curs).y = L'\0';
  }
  else {
    swap_screen(term,L'\x01',false,false);
    erase_lots(term,false,true,true);
    swap_screen(term,L'\0',false,false);
    if (clear) {
      erase_lots(term,false,true,true);
    }
    wVar4 = find_last_nonempty_line(term,term->screen);
    (term->curs).y = wVar4 + L'\x01';
    if ((term->curs).y == term->rows) {
      (term->curs).y = (term->curs).y + L'\xffffffff';
      scroll(term,L'\0',term->rows + L'\xffffffff',L'\x01',true);
    }
  }
  (term->curs).x = L'\0';
  term_schedule_tblink(term);
  term_schedule_cblink(term);
  term_schedule_update(term);
  return;
}

Assistant:

static void power_on(Terminal *term, bool clear)
{
    term->alt_x = term->alt_y = 0;
    term->savecurs.x = term->savecurs.y = 0;
    term->alt_savecurs.x = term->alt_savecurs.y = 0;
    term->alt_t = term->marg_t = 0;
    if (term->rows != -1)
        term->alt_b = term->marg_b = term->rows - 1;
    else
        term->alt_b = term->marg_b = 0;
    if (term->cols != -1) {
        int i;
        for (i = 0; i < term->cols; i++)
            term->tabs[i] = (i % 8 == 0 ? true : false);
    }
    term->alt_om = term->dec_om = conf_get_bool(term->conf, CONF_dec_om);
    term->alt_ins = false;
    term->insert = false;
    term->alt_wnext = false;
    term->wrapnext = false;
    term->save_wnext = false;
    term->alt_save_wnext = false;
    term->alt_wrap = term->wrap = conf_get_bool(term->conf, CONF_wrap_mode);
    term->alt_cset = term->cset = term->save_cset = term->alt_save_cset = 0;
    term->alt_utf = false;
    term->utf = false;
    term->save_utf = false;
    term->alt_save_utf = false;
    term->utf8.state = 0;
    term->alt_sco_acs = term->sco_acs =
        term->save_sco_acs = term->alt_save_sco_acs = 0;
    term->cset_attr[0] = term->cset_attr[1] =
        term->save_csattr = term->alt_save_csattr = CSET_ASCII;
    term->rvideo = false;
    term->in_vbell = false;
    term->cursor_on = true;
    term->big_cursor = false;
    term->default_attr = term->save_attr =
        term->alt_save_attr = term->curr_attr = ATTR_DEFAULT;
    term->curr_truecolour.fg = term->curr_truecolour.bg = optionalrgb_none;
    term->save_truecolour = term->alt_save_truecolour = term->curr_truecolour;
    term->app_cursor_keys = conf_get_bool(term->conf, CONF_app_cursor);
    term->app_keypad_keys = conf_get_bool(term->conf, CONF_app_keypad);
    term->use_bce = conf_get_bool(term->conf, CONF_bce);
    term->blink_is_real = conf_get_bool(term->conf, CONF_blinktext);
    term->erase_char = term->basic_erase_char;
    term->alt_which = 0;
    term_print_finish(term);
    term->xterm_mouse = 0;
    term->xterm_extended_mouse = false;
    term->urxvt_extended_mouse = false;
    win_set_raw_mouse_mode(term->win, false);
    term->win_pointer_shape_pending = true;
    term->win_pointer_shape_raw = false;
    term->bracketed_paste = false;
    term->srm_echo = false;
    {
        int i;
        for (i = 0; i < 256; i++)
            term->wordness[i] = conf_get_int_int(term->conf, CONF_wordness, i);
    }
    if (term->screen) {
        swap_screen(term, 1, false, false);
        erase_lots(term, false, true, true);
        swap_screen(term, 0, false, false);
        if (clear)
            erase_lots(term, false, true, true);
        term->curs.y = find_last_nonempty_line(term, term->screen) + 1;
        if (term->curs.y == term->rows) {
            term->curs.y--;
            scroll(term, 0, term->rows - 1, 1, true);
        }
    } else {
        term->curs.y = 0;
    }
    term->curs.x = 0;
    term_schedule_tblink(term);
    term_schedule_cblink(term);
    term_schedule_update(term);
}